

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

double GetTime(void)

{
  uint64_t uVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    dVar3 = 0.0;
  }
  else {
    uVar1 = _glfwPlatformGetTimerValue();
    lVar2 = uVar1 - _glfw.timer.offset;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    uVar1 = _glfwPlatformGetTimerFrequency();
    auVar5._8_4_ = (int)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  return dVar3;
}

Assistant:

double GetTime(void)
{
#if defined(PLATFORM_DESKTOP) || defined(PLATFORM_WEB)
    return glfwGetTime();                   // Elapsed time since glfwInit()
#endif

#if defined(PLATFORM_ANDROID) || defined(PLATFORM_RPI) || defined(PLATFORM_DRM)
    struct timespec ts;
    clock_gettime(CLOCK_MONOTONIC, &ts);
    unsigned long long int time = (unsigned long long int)ts.tv_sec*1000000000LLU + (unsigned long long int)ts.tv_nsec;

    return (double)(time - CORE.Time.base)*1e-9;  // Elapsed time since InitTimer()
#endif

#if defined(PLATFORM_UWP)
    return UWPGetQueryTimeFunc()();
#endif
}